

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_dispatch.c
# Opt level: O2

int replyConnection(void *ptr,mpt_reply_data *rd,mpt_message *msg)

{
  int iVar1;
  mpt_connection *con;
  
  if (-1 < *(int *)((long)ptr + 8)) {
    iVar1 = mpt_outdata_reply((mpt_outdata *)ptr,(ulong)rd->len,rd->val,msg);
    return iVar1;
  }
  if (*ptr == (mpt_stream *)0x0) {
    iVar1 = -1;
  }
  else {
    if (rd->len == (ushort)*(byte *)((long)ptr + 0xd)) {
      iVar1 = mpt_stream_reply(*ptr,(ulong)rd->len,rd->val,msg);
      return iVar1;
    }
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

static int replyConnection(void *ptr, const MPT_STRUCT(reply_data) *rd, const MPT_STRUCT(message) *msg)
{
	MPT_STRUCT(connection) *con = ptr;
	
	if (!MPT_socket_active(&con->out.sock)) {
		MPT_STRUCT(buffer) *buf;
		
		if (!(buf = con->out.buf._buf)) {
			return MPT_ERROR(BadArgument);
		}
		if (con->out._idlen != rd->len) {
			return MPT_ERROR(BadValue);
		}
		return mpt_stream_reply((void *) buf, rd->len, rd->val, msg);
	}
	return mpt_outdata_reply(&con->out, rd->len, rd->val, msg);
}